

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

uint32_t __thiscall FpgaIO::PromGetId(FpgaIO *this)

{
  BasePort *pBVar1;
  uint uVar2;
  uint32_t local_14;
  quadlet_t data;
  uint32_t id;
  FpgaIO *this_local;
  
  local_14 = 0;
  pBVar1 = (this->super_BoardIO).port;
  _data = this;
  uVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,8,0x9f000000);
  if ((uVar2 & 1) != 0) {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    PromGetResult(this,&local_14,PROM_M25P16);
  }
  return local_14;
}

Assistant:

uint32_t FpgaIO::PromGetId(void)
{
    uint32_t id = 0;
    quadlet_t data = 0x9f000000;
    if (port->WriteQuadlet(BoardId, 0x08, data)) {
        port->PromDelay();
        // Should be ready by now...
        PromGetResult(id);
    }
    return id;
}